

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O2

void test_4(void)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  element_type *peVar3;
  ChStreamOutAscii *pCVar4;
  shared_ptr<chrono::fea::ChNodeFEAxyz> sVar5;
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  shared_ptr<chrono::ChBody> truss;
  undefined1 local_7a8 [16];
  double local_798;
  ChVector<double> v;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode7;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode6;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode5;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode4;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode3;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode2;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode1;
  shared_ptr<chrono::fea::ChContinuumElastic> mmaterial;
  shared_ptr<chrono::ChSolverMINRES> solver;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint4;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint3;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint2;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint1;
  shared_ptr<chrono::fea::ChElementHexaCorot_8> melement1;
  undefined8 local_678;
  undefined8 uStack_670;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_668;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_658;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_648;
  __shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> local_638 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_630;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_628 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_620;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_618 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_610;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_608 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_600;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_5f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5f0;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_5e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e0;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_5d8;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_5c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5c0;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_5b8;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_5a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5a0;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_598;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_588 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_580;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_578;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_568 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_560;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_558 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_550;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_548 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_540;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_538;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_528;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_518;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_508;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_4f8;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_4e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_4d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_4c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4c0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_4b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_4a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_498 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_490;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_488 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_480;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_478 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  __shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> local_468;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined1 local_438 [16];
  undefined8 local_428;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  ChSystemSMC sys;
  
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar4,"\n-------------------------------------------------\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar4,"TEST: LINEAR hexahedral element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC(&sys,true);
  std::make_shared<chrono::fea::ChMesh>();
  std::make_shared<chrono::fea::ChContinuumElastic>();
  chrono::fea::ChContinuumElastic::Set_E(207000000.0);
  chrono::fea::ChContinuumElastic::Set_v(0.3);
  v.m_data[2] = 0.0;
  v.m_data._0_16_ = ZEXT816(0);
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode1);
  v.m_data._0_16_ = ZEXT816(0);
  v.m_data[2] = 0.01;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode2);
  v.m_data._0_16_ = ZEXT816(0x3f847ae147ae147b);
  v.m_data[2] = 0.01;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode3);
  v.m_data._0_16_ = ZEXT816(0x3f847ae147ae147b);
  v.m_data[2] = 0.0;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode4);
  v.m_data._0_16_ = vmovhpd_avx(ZEXT816(0) << 0x40,0x3fb999999999999a);
  v.m_data[2] = 0.0;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode5);
  v.m_data._0_16_ = vmovhpd_avx(ZEXT816(0) << 0x40,0x3fb999999999999a);
  v.m_data[2] = 0.01;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode6);
  v.m_data[0] = 0.01;
  v.m_data[1] = 0.1;
  v.m_data[2] = 0.01;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode7);
  v.m_data[1] = 0.1;
  v.m_data[0] = 0.01;
  v.m_data[2] = 0.0;
  sVar5 = std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>
                    ((ChVector<double> *)&mnode8);
  auVar1 = vmovhpd_avx(ZEXT816(0) << 0x40,0xc08f400000000000);
  local_3e8 = 0;
  local_3f8 = auVar1;
  (**(code **)(*(long *)mnode5.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))
            (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,local_3f8,
             sVar5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  local_678 = auVar1._0_8_;
  uStack_670 = auVar1._8_8_;
  local_418 = local_678;
  uStack_410 = uStack_670;
  local_408 = 0;
  (**(code **)(*(long *)mnode6.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  auVar1 = vmovhpd_avx(ZEXT816(0),0xc08f400000000000);
  local_428 = 0;
  local_438 = auVar1;
  (**(code **)(*(long *)mnode7.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_678 = auVar1._0_8_;
  uStack_670 = auVar1._8_8_;
  local_458 = local_678;
  uStack_450 = uStack_670;
  local_448 = 0;
  (**(code **)(*(long *)mnode8.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  peVar2 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_478,
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar2,local_478);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_470);
  peVar2 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_488,
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar2,local_488);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_480);
  peVar2 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_498,
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar2,local_498);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_490);
  peVar2 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_4a8,
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar2,local_4a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4a0);
  peVar2 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_4b8,
             &mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar2,local_4b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4b0);
  peVar2 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_4c8,
             &mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar2,local_4c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4c0);
  peVar2 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_4d8,
             &mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar2,local_4d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4d0);
  peVar2 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_4e8,
             &mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar2,local_4e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4e0);
  std::make_shared<chrono::fea::ChElementHexaCorot_8>();
  peVar3 = melement1.
           super___shared_ptr<chrono::fea::ChElementHexaCorot_8,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_648,
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_658,
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_668,
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4f8,
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_508,
             &mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_518,
             &mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_528,
             &mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_538,
             &mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)peVar3 + 0x38))
            (peVar3,&local_648,&local_658,&local_668,&local_4f8,&local_508,&local_518,&local_528,
             &local_538);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_538._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_528._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_518._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_508._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4f8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_668._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_658._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_648._M_refcount);
  std::__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_468,
             &mmaterial.
              super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> *)
             (melement1.
              super___shared_ptr<chrono::fea::ChElementHexaCorot_8,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 0xb8),&local_468);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_468._M_refcount);
  std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChElementHexaCorot_8,void>
            (local_548,
             &melement1.
              super___shared_ptr<chrono::fea::ChElementHexaCorot_8,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddElement
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_548);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_540);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChMesh,void>
            (local_558,&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
  ;
  chrono::ChSystem::Add(&sys,local_558);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_550);
  chrono_types::make_shared<chrono::ChBody,_0>();
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_568,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_568);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_560);
  chrono::ChBody::SetBodyFixed
            ((bool)truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_
            );
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_578,
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_588,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)constraint1.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint1.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_578,local_588);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_580);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_578._M_refcount);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_598,
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_5a8,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)constraint2.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint2.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_598,local_5a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_598._M_refcount);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_5b8,
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_5c8,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)constraint3.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint3.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_5b8,local_5c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5b8._M_refcount);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_5d8,
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_5e8,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)constraint4.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint4.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_5d8,local_5e8,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5d8._M_refcount);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_5f8,
             &constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_5f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5f0);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_608,
             &constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_608);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_600);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_618,
             &constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_618);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_610);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_628,
             &constraint4.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_628);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_620);
  std::make_shared<chrono::ChSolverMINRES>();
  std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChSolverMINRES,void>
            (local_638,
             &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::SetSolver(&sys,local_638);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_630);
  *(undefined4 *)
   (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0xc) =
       100;
  *(undefined8 *)
   (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10) =
       0x3d719799812dea11;
  solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr[8] =
       (element_type)0x1;
  solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x20] =
       (element_type)0x1;
  chrono::ChSystem::DoStaticLinear();
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = chrono::operator<<(pCVar4,(ChVector<double> *)
                                     (mnode1.
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = chrono::operator<<(pCVar4,(ChVector<double> *)
                                     (mnode2.
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = chrono::operator<<(pCVar4,(ChVector<double> *)
                                     (mnode3.
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = chrono::operator<<(pCVar4,(ChVector<double> *)
                                     (mnode4.
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,"node5 displ: ");
  (**(code **)(*(long *)mnode5.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (local_7a8,
             mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])
                   (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x20),local_7a8);
  v.m_data[2] = *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30) - local_798;
  pCVar4 = chrono::operator<<(pCVar4,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,"node6 displ: ");
  (**(code **)(*(long *)mnode6.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (local_7a8,
             mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])
                   (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x20),local_7a8);
  v.m_data[2] = *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30) - local_798;
  pCVar4 = chrono::operator<<(pCVar4,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,"node7 displ: ");
  (**(code **)(*(long *)mnode7.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (local_7a8,
             mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])
                   (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x20),local_7a8);
  v.m_data[2] = *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30) - local_798;
  pCVar4 = chrono::operator<<(pCVar4,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  pCVar4 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar4 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar4,"node8 displ: ");
  (**(code **)(*(long *)mnode8.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (local_7a8,
             mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])
                   (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x20),local_7a8);
  v.m_data[2] = *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30) - local_798;
  pCVar4 = chrono::operator<<(pCVar4,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar4,"\n");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraint4.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&melement1.
              super___shared_ptr<chrono::fea::ChElementHexaCorot_8,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mmaterial.
              super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystemSMC::~ChSystemSMC(&sys);
  return;
}

Assistant:

void test_4() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: LINEAR hexahedral element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create a material, that must be assigned to each element,
    // and set its parameters
    auto mmaterial = chrono_types::make_shared<ChContinuumElastic>();
    mmaterial->Set_E(207e6);
    mmaterial->Set_v(0.3);

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    double sx = 0.01;
    double sy = 0.10;
    double sz = 0.01;
    auto mnode1 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnode2 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, sz));
    auto mnode3 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, 0, sz));
    auto mnode4 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, 0, 0));
    auto mnode5 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, sy, 0));
    auto mnode6 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, sy, sz));
    auto mnode7 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, sy, sz));
    auto mnode8 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, sy, 0));

    // For example, set applied forces to nodes:
    mnode5->SetForce(ChVector<>(0, -1000, 0));
    mnode6->SetForce(ChVector<>(0, -1000, 0));
    mnode7->SetForce(ChVector<>(0, -1000, 0));
    mnode8->SetForce(ChVector<>(0, -1000, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnode1);
    my_mesh->AddNode(mnode2);
    my_mesh->AddNode(mnode3);
    my_mesh->AddNode(mnode4);
    my_mesh->AddNode(mnode5);
    my_mesh->AddNode(mnode6);
    my_mesh->AddNode(mnode7);
    my_mesh->AddNode(mnode8);

    // Create the tetrahedron element, and assign
    // it nodes and material
    auto melement1 = chrono_types::make_shared<ChElementHexaCorot_8>();
    melement1->SetNodes(mnode1, mnode2, mnode3, mnode4, mnode5, mnode6, mnode7, mnode8);
    melement1->SetMaterial(mmaterial);

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melement1);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    sys.Add(truss);
    truss->SetBodyFixed(true);

    // Create a constraint between a node and the truss
    auto constraint1 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint2 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint3 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint4 = chrono_types::make_shared<ChLinkPointFrame>();

    constraint1->Initialize(mnode1,   // node
                            truss);   // body to be connected to

    constraint2->Initialize(mnode2,   // node
                            truss);   // body to be connected to

    constraint3->Initialize(mnode3,   // node
                            truss);   // body to be connected to

    constraint4->Initialize(mnode4,   // node
                            truss);   // body to be connected to

    sys.Add(constraint1);
    sys.Add(constraint2);
    sys.Add(constraint3);
    sys.Add(constraint4);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(100);
    solver->SetTolerance(1e-12);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output result
    // GetLog()<<melement1.GetStiffnessMatrix()<<"\n";
    // GetLog()<<melement1.GetMatrB()<<"\n";
    GetLog() << mnode1->GetPos() << "\n";
    GetLog() << mnode2->GetPos() << "\n";
    GetLog() << mnode3->GetPos() << "\n";
    GetLog() << mnode4->GetPos() << "\n";
    GetLog() << "node5 displ: " << mnode5->GetPos() - mnode5->GetX0() << "\n";
    GetLog() << "node6 displ: " << mnode6->GetPos() - mnode6->GetX0() << "\n";
    GetLog() << "node7 displ: " << mnode7->GetPos() - mnode7->GetX0() << "\n";
    GetLog() << "node8 displ: " << mnode8->GetPos() - mnode8->GetX0() << "\n";
}